

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O2

ssize_t __thiscall
crnlib::buffer_stream::read(buffer_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint uVar2;
  size_t __n;
  undefined4 in_register_00000034;
  
  __n = 0;
  if (((((this->super_data_stream).field_0x1a & 1) != 0) && ((uint)__buf != 0)) &&
     (((this->super_data_stream).m_attribs & 1) != 0)) {
    uVar2 = this->m_size;
    uVar1 = this->m_ofs;
    __n = (size_t)(uVar2 - uVar1);
    if ((uint)__buf < uVar2 - uVar1) {
      __n = (ulong)__buf & 0xffffffff;
    }
    if (uVar2 != uVar1) {
      memcpy((void *)CONCAT44(in_register_00000034,__fd),this->m_pBuf + uVar1,__n);
      uVar2 = this->m_ofs;
    }
    this->m_ofs = uVar2 + (int)__n;
  }
  return __n;
}

Assistant:

virtual uint read(void* pBuf, uint len) {
    CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

    if ((!m_opened) || (!is_readable()) || (!len))
      return 0;

    CRNLIB_ASSERT(m_ofs <= m_size);

    uint bytes_left = m_size - m_ofs;

    len = math::minimum<uint>(len, bytes_left);

    if (len)
      memcpy(pBuf, &m_pBuf[m_ofs], len);

    m_ofs += len;

    return len;
  }